

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

char * kj::_::fill<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>>
                 (char *target,ArrayPtr<const_char> *first,FixedArray<char,_1UL> *rest)

{
  char *pcVar1;
  size_t sVar2;
  size_t sVar3;
  
  pcVar1 = first->ptr;
  sVar2 = first->size_;
  for (sVar3 = 0; sVar2 != sVar3; sVar3 = sVar3 + 1) {
    target[sVar3] = pcVar1[sVar3];
  }
  target[sVar3] = rest->content[0];
  return target + sVar3 + 1;
}

Assistant:

inline constexpr const T* begin() const { return ptr; }